

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_std::utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide
          (utf8_moneypunct_from_wide<true> *this,locale *base,size_t refs)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  moneypunct *pmVar5;
  bool bVar6;
  string tmp_grouping;
  allocator local_a1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a0;
  string *local_80;
  string local_78;
  string local_58;
  string *local_38;
  
  std::__cxx11::moneypunct<char,true>::moneypunct((ulong)this);
  *(undefined ***)this = &PTR__utf8_moneypunct_from_wide_001dbef0;
  (this->grouping_)._M_dataplus._M_p = (pointer)&(this->grouping_).field_2;
  (this->grouping_)._M_string_length = 0;
  (this->grouping_).field_2._M_local_buf[0] = '\0';
  (this->curr_symbol_)._M_dataplus._M_p = (pointer)&(this->curr_symbol_).field_2;
  (this->curr_symbol_)._M_string_length = 0;
  (this->curr_symbol_).field_2._M_local_buf[0] = '\0';
  local_80 = (string *)&this->positive_sign_;
  (this->positive_sign_)._M_dataplus._M_p = (pointer)&(this->positive_sign_).field_2;
  (this->positive_sign_)._M_string_length = 0;
  (this->positive_sign_).field_2._M_local_buf[0] = '\0';
  (this->negative_sign_)._M_dataplus._M_p = (pointer)&(this->negative_sign_).field_2;
  (this->negative_sign_)._M_string_length = 0;
  (this->negative_sign_).field_2._M_local_buf[0] = '\0';
  local_38 = &this->curr_symbol_;
  pmVar5 = std::use_facet<std::__cxx11::moneypunct<wchar_t,true>>(base);
  (**(code **)(*(long *)pmVar5 + 0x28))(&local_a0,pmVar5);
  std::__cxx11::string::string((string *)&local_78,"UTF-8",&local_a1);
  conv::from_utf<wchar_t>(&local_58,&local_a0,&local_78,default_method);
  std::__cxx11::string::operator=((string *)&this->curr_symbol_,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::wstring::~wstring((wstring *)&local_a0);
  (**(code **)(*(long *)pmVar5 + 0x30))(&local_a0,pmVar5);
  std::__cxx11::string::string((string *)&local_78,"UTF-8",&local_a1);
  conv::from_utf<wchar_t>(&local_58,&local_a0,&local_78,default_method);
  std::__cxx11::string::operator=(local_80,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::wstring::~wstring((wstring *)&local_a0);
  (**(code **)(*(long *)pmVar5 + 0x38))(&local_a0,pmVar5);
  std::__cxx11::string::string((string *)&local_78,"UTF-8",&local_a1);
  conv::from_utf<wchar_t>(&local_58,&local_a0,&local_78,default_method);
  std::__cxx11::string::operator=((string *)&this->negative_sign_,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::wstring::~wstring((wstring *)&local_a0);
  iVar1 = (**(code **)(*(long *)pmVar5 + 0x40))(pmVar5);
  this->frac_digits_ = iVar1;
  uVar2 = (**(code **)(*(long *)pmVar5 + 0x48))(pmVar5);
  *(undefined4 *)(this->pos_format_).field = uVar2;
  uVar2 = (**(code **)(*(long *)pmVar5 + 0x50))(pmVar5);
  *(undefined4 *)(this->neg_format_).field = uVar2;
  iVar1 = (**(code **)(*(long *)pmVar5 + 0x10))(pmVar5);
  iVar3 = (**(code **)(*(long *)pmVar5 + 0x18))(pmVar5);
  (**(code **)(*(long *)pmVar5 + 0x20))(&local_58,pmVar5);
  uVar4 = iVar1 - 0x20;
  if (((uVar4 < 0x5f) && (iVar3 - 0x20U < 0x5f)) ||
     (bVar6 = iVar3 == 0xa0, iVar3 = 0x20, bVar6 && uVar4 < 0x5f)) {
    this->thousands_sep_ = (char)iVar3;
    this->decimal_point_ = (char)iVar1;
    std::__cxx11::string::_M_assign((string *)&this->grouping_);
  }
  else {
    this->thousands_sep_ = ',';
    if (uVar4 < 0x5f) {
      this->decimal_point_ = (char)iVar1;
    }
    else {
      this->decimal_point_ = '.';
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0]._0_1_ = 0;
    std::__cxx11::string::operator=((string *)&this->grouping_,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

utf8_moneypunct_from_wide(std::locale const &base,size_t refs = 0) : std::moneypunct<char,Intl>(refs)
    {
        typedef std::moneypunct<wchar_t,Intl> wfacet_type;
        wfacet_type const &wfacet = std::use_facet<wfacet_type>(base);

        curr_symbol_ = conv::from_utf<wchar_t>(wfacet.curr_symbol(),"UTF-8");
        positive_sign_ = conv::from_utf<wchar_t>(wfacet.positive_sign(),"UTF-8");
        negative_sign_ = conv::from_utf<wchar_t>(wfacet.negative_sign(),"UTF-8");
        frac_digits_ = wfacet.frac_digits();
        pos_format_ = wfacet.pos_format();
        neg_format_ = wfacet.neg_format();

        wchar_t tmp_decimal_point = wfacet.decimal_point();
        wchar_t tmp_thousands_sep = wfacet.thousands_sep();
        std::string tmp_grouping = wfacet.grouping();
        if( 32 <= tmp_thousands_sep && tmp_thousands_sep <=126 &&
            32 <= tmp_decimal_point && tmp_decimal_point <=126)
        {
            thousands_sep_ = static_cast<char>(tmp_thousands_sep);
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_ = tmp_grouping;
        }
        else if(32 <= tmp_decimal_point && tmp_decimal_point <=126 && tmp_thousands_sep == 0xA0) {
            // workaround common bug - substitute NBSP with ordinary space
            thousands_sep_ = ' ';
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_ = tmp_grouping;
        }
        else if(32 <= tmp_decimal_point && tmp_decimal_point <=126)
        {
            thousands_sep_=',';
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_=std::string();
        }
        else {
            thousands_sep_ = ',';
            decimal_point_ = '.';
            grouping_=std::string();
        }
    }